

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int queue_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  long *plVar1;
  undefined8 local_38;
  queue_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  plVar1 = (long *)segment->data;
  switch(field) {
  case 1:
    *(bool *)value = segment->mix == queue_segment_mix_bypass;
    break;
  default:
    mixed_err(7);
    return 0;
  case 0x24:
    *(int *)value = (int)plVar1[5];
    break;
  case 0x25:
    *(int *)value = (int)plVar1[3];
    break;
  case 0x26:
    if (*plVar1 == 0) {
      local_38 = 0;
    }
    else {
      local_38 = *(undefined8 *)*plVar1;
    }
    *(undefined8 *)value = local_38;
  }
  return 1;
}

Assistant:

int queue_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == queue_segment_mix_bypass); break;
  case MIXED_CURRENT_SEGMENT: *((struct mixed_segment **)value) = (data->queue)?data->queue[0]:0; break;
  case MIXED_IN_COUNT: *((uint32_t *)value) = data->in_count; break;
  case MIXED_OUT_COUNT: *((uint32_t *)value) = data->out_count; break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}